

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O3

spvc_result
spvc_compiler_msl_add_shader_output(spvc_compiler compiler,spvc_msl_shader_interface_var *so)

{
  spvc_context this;
  spvc_result sVar1;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  MSLShaderInterfaceVariable local_30;
  
  if (compiler->backend == SPVC_BACKEND_MSL) {
    sVar1 = SPVC_SUCCESS;
    local_30.component = 0;
    local_30.rate = MSL_SHADER_VARIABLE_RATE_PER_VERTEX;
    local_30.location = so->location;
    local_30.format = so->format;
    local_30.builtin = so->builtin;
    local_30.vecsize = so->vecsize;
    spirv_cross::CompilerMSL::add_msl_shader_output
              ((CompilerMSL *)
               (compiler->compiler)._M_t.
               super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
               ._M_t.
               super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
               .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl,&local_30);
  }
  else {
    this = compiler->context;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"MSL function used on a non-MSL backend.","");
    std::__cxx11::string::operator=((string *)this,(string *)local_50);
    if (this->callback != (spvc_error_callback)0x0) {
      (*this->callback)(this->callback_userdata,(this->last_error)._M_dataplus._M_p);
    }
    sVar1 = SPVC_ERROR_INVALID_ARGUMENT;
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
  }
  return sVar1;
}

Assistant:

spvc_result spvc_compiler_msl_add_shader_output(spvc_compiler compiler, const spvc_msl_shader_interface_var *so)
{
#if SPIRV_CROSS_C_API_MSL
	if (compiler->backend != SPVC_BACKEND_MSL)
	{
		compiler->context->report_error("MSL function used on a non-MSL backend.");
		return SPVC_ERROR_INVALID_ARGUMENT;
	}

	auto &msl = *static_cast<CompilerMSL *>(compiler->compiler.get());
	MSLShaderInterfaceVariable output;
	output.location = so->location;
	output.format = static_cast<MSLShaderVariableFormat>(so->format);
	output.builtin = static_cast<spv::BuiltIn>(so->builtin);
	output.vecsize = so->vecsize;
	msl.add_msl_shader_output(output);
	return SPVC_SUCCESS;
#else
	(void)so;
	compiler->context->report_error("MSL function used on a non-MSL backend.");
	return SPVC_ERROR_INVALID_ARGUMENT;
#endif
}